

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum_to_spectrum.cc
# Opt level: O3

void __thiscall sptk::SpectrumToSpectrum::~SpectrumToSpectrum(SpectrumToSpectrum *this)

{
  pointer ppOVar1;
  pointer ppOVar2;
  
  this->_vptr_SpectrumToSpectrum = (_func_int **)&PTR__SpectrumToSpectrum_001158f8;
  ppOVar2 = (this->operations_).
            super__Vector_base<sptk::SpectrumToSpectrum::OperationInterface_*,_std::allocator<sptk::SpectrumToSpectrum::OperationInterface_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppOVar1 = (this->operations_).
            super__Vector_base<sptk::SpectrumToSpectrum::OperationInterface_*,_std::allocator<sptk::SpectrumToSpectrum::OperationInterface_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppOVar2 != ppOVar1) {
    do {
      if (*ppOVar2 != (OperationInterface *)0x0) {
        (*(*ppOVar2)->_vptr_OperationInterface[1])();
        ppOVar1 = (this->operations_).
                  super__Vector_base<sptk::SpectrumToSpectrum::OperationInterface_*,_std::allocator<sptk::SpectrumToSpectrum::OperationInterface_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      ppOVar2 = ppOVar2 + 1;
    } while (ppOVar2 != ppOVar1);
    ppOVar2 = (this->operations_).
              super__Vector_base<sptk::SpectrumToSpectrum::OperationInterface_*,_std::allocator<sptk::SpectrumToSpectrum::OperationInterface_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  if (ppOVar2 == (pointer)0x0) {
    return;
  }
  operator_delete(ppOVar2);
  return;
}

Assistant:

SpectrumToSpectrum::~SpectrumToSpectrum() {
  for (std::vector<SpectrumToSpectrum::OperationInterface*>::iterator itr(
           operations_.begin());
       itr != operations_.end(); ++itr) {
    delete (*itr);
  }
}